

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v10::detail::bigint::subtract_bigits(bigint *this,int index,bigit other,bigit *borrow)

{
  uint *puVar1;
  long lVar2;
  
  if (index < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x189,"negative value");
    lVar2 = (ulong)(this->bigits_).super_buffer<unsigned_int>.ptr_[(uint)index] -
            ((ulong)*borrow + (ulong)other);
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x189,"negative value");
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  }
  else {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar2 = (ulong)puVar1[(uint)index] - ((ulong)*borrow + (ulong)other);
  }
  puVar1[(uint)index] = (uint)lVar2;
  *borrow = (uint)((ulong)lVar2 >> 0x3f);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_bigits(int index, bigit other, bigit& borrow) {
    auto result = static_cast<double_bigit>((*this)[index]) - other - borrow;
    (*this)[index] = static_cast<bigit>(result);
    borrow = static_cast<bigit>(result >> (bigit_bits * 2 - 1));
  }